

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O2

ps_latlink_t * fsg_search_bestpath(ps_search_t *search,int32 *out_score,int backward)

{
  int32 iVar1;
  ps_latlink_t *ppVar2;
  
  ppVar2 = search->last_link;
  if (ppVar2 == (ps_latlink_t *)0x0) {
    ppVar2 = ps_lattice_bestpath(search->dag,(ngram_model_t *)0x0,1.0,(float32)search[1].start_wid);
    search->last_link = ppVar2;
    if (ppVar2 == (ps_latlink_t *)0x0) {
      return (ps_latlink_t *)0x0;
    }
    if (search->post == 0) {
      iVar1 = ps_lattice_posterior(search->dag,(ngram_model_t *)0x0,(float32)search[1].start_wid);
      search->post = iVar1;
      ppVar2 = search->last_link;
    }
  }
  if (out_score != (int32 *)0x0) {
    *out_score = search->dag->final_node_ascr + ppVar2->path_scr;
  }
  return ppVar2;
}

Assistant:

static ps_latlink_t *
fsg_search_bestpath(ps_search_t *search, int32 *out_score, int backward)
{
    fsg_search_t *fsgs = (fsg_search_t *)search;

    (void)backward;
    if (search->last_link == NULL) {
        search->last_link = ps_lattice_bestpath(search->dag, NULL,
                                                1.0, fsgs->ascale);
        if (search->last_link == NULL)
            return NULL;
        /* Also calculate betas so we can fill in the posterior
         * probability field in the segmentation. */
        if (search->post == 0)
            search->post = ps_lattice_posterior(search->dag, NULL, fsgs->ascale);
    }
    if (out_score)
        *out_score = search->last_link->path_scr + search->dag->final_node_ascr;
    return search->last_link;
}